

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  void *in_RDX;
  ImDrawCallback in_RSI;
  int *in_RDI;
  ImDrawCmd *current_cmd;
  ImVector<ImDrawCmd> *in_stack_ffffffffffffffd0;
  ImDrawCmd *local_20;
  
  if (*in_RDI == 0) {
    local_20 = (ImDrawCmd *)0x0;
  }
  else {
    local_20 = ImVector<ImDrawCmd>::back(in_stack_ffffffffffffffd0);
  }
  if (((local_20 == (ImDrawCmd *)0x0) || (local_20->ElemCount != 0)) ||
     (local_20->UserCallback != (ImDrawCallback)0x0)) {
    AddDrawCmd((ImDrawList *)callback_data);
    local_20 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)local_20);
  }
  local_20->UserCallback = in_RSI;
  local_20->UserCallbackData = in_RDX;
  AddDrawCmd((ImDrawList *)callback_data);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}